

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

App_p __thiscall CLI::App::get_subcommand_ptr(App *this,string *subcom)

{
  pointer pcVar1;
  App *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  OptionNotFound *this_01;
  long *in_RDX;
  pointer pcVar4;
  App_p AVar5;
  string local_70;
  string local_50;
  
  pcVar4 = subcom[0x16]._M_dataplus._M_p;
  pcVar1 = (pointer)subcom[0x16]._M_string_length;
  if (pcVar4 != pcVar1) {
    do {
      this_00 = *(App **)pcVar4;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,*in_RDX,in_RDX[1] + *in_RDX);
      bVar3 = check_name(this_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar3) {
        this->_vptr_App = *(_func_int ***)pcVar4;
        _Var2._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pcVar4 + 8);
        (this->name_)._M_dataplus._M_p = (pointer)_Var2._M_pi;
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
          }
        }
        AVar5.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var2._M_pi;
        AVar5.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
        return (App_p)AVar5.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
      }
      pcVar4 = pcVar4 + 0x10;
    } while (pcVar4 != pcVar1);
  }
  this_01 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,*in_RDX,in_RDX[1] + *in_RDX);
  OptionNotFound::OptionNotFound(this_01,&local_50);
  __cxa_throw(this_01,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE CLI::App_p App::get_subcommand_ptr(std::string subcom) const {
    for(const App_p &subcomptr : subcommands_)
        if(subcomptr->check_name(subcom))
            return subcomptr;
    throw OptionNotFound(subcom);
}